

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O3

bool __thiscall cfd::core::ByteData160::IsEmpty(ByteData160 *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  pointer puVar3;
  pointer puVar4;
  value_type_conflict *__val;
  undefined1 (*pauVar5) [16];
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  pauVar5 = (undefined1 (*) [16])operator_new(0x14);
  *pauVar5 = (undefined1  [16])0x0;
  *(undefined4 *)pauVar5[1] = 0;
  puVar3 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)puVar4 - (long)puVar3 == 0x14) {
    if (puVar4 == puVar3) {
      bVar6 = true;
    }
    else {
      auVar7[0] = -((*pauVar5)[0] == *puVar3);
      auVar7[1] = -((*pauVar5)[1] == puVar3[1]);
      auVar7[2] = -((*pauVar5)[2] == puVar3[2]);
      auVar7[3] = -((*pauVar5)[3] == puVar3[3]);
      auVar7[4] = -((*pauVar5)[4] == puVar3[4]);
      auVar7[5] = -((*pauVar5)[5] == puVar3[5]);
      auVar7[6] = -((*pauVar5)[6] == puVar3[6]);
      auVar7[7] = -((*pauVar5)[7] == puVar3[7]);
      auVar7[8] = -((*pauVar5)[8] == puVar3[8]);
      auVar7[9] = -((*pauVar5)[9] == puVar3[9]);
      auVar7[10] = -((*pauVar5)[10] == puVar3[10]);
      auVar7[0xb] = -((*pauVar5)[0xb] == puVar3[0xb]);
      auVar7[0xc] = -((*pauVar5)[0xc] == puVar3[0xc]);
      auVar7[0xd] = -((*pauVar5)[0xd] == puVar3[0xd]);
      auVar7[0xe] = -((*pauVar5)[0xe] == puVar3[0xe]);
      auVar7[0xf] = -((*pauVar5)[0xf] == puVar3[0xf]);
      uVar1 = *(undefined4 *)(puVar3 + 0x10);
      uVar2 = *(undefined4 *)pauVar5[1];
      auVar8[0] = -((char)uVar2 == (char)uVar1);
      auVar8[1] = -((char)((uint)uVar2 >> 8) == (char)((uint)uVar1 >> 8));
      auVar8[2] = -((char)((uint)uVar2 >> 0x10) == (char)((uint)uVar1 >> 0x10));
      auVar8[3] = -((char)((uint)uVar2 >> 0x18) == (char)((uint)uVar1 >> 0x18));
      auVar8[4] = 0xff;
      auVar8[5] = 0xff;
      auVar8[6] = 0xff;
      auVar8[7] = 0xff;
      auVar8[8] = 0xff;
      auVar8[9] = 0xff;
      auVar8[10] = 0xff;
      auVar8[0xb] = 0xff;
      auVar8[0xc] = 0xff;
      auVar8[0xd] = 0xff;
      auVar8[0xe] = 0xff;
      auVar8[0xf] = 0xff;
      auVar8 = auVar8 & auVar7;
      bVar6 = (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff;
    }
  }
  else {
    bVar6 = false;
  }
  operator_delete(pauVar5);
  return bVar6;
}

Assistant:

bool ByteData160::IsEmpty() const {
  std::vector<uint8_t> data(kByteData160Length);
  memset(data.data(), 0, data.size());
  return data_ == data;
}